

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

int Bac_ManBoxNum_rec(Bac_Ntk_t *p)

{
  Bac_Man_t *pBVar1;
  int iVar2;
  Bac_ObjType_t BVar3;
  int iVar4;
  Bac_Ntk_t *p_00;
  int i;
  long lVar5;
  
  iVar4 = p->Count;
  if (iVar4 < 0) {
    iVar4 = 0;
    for (lVar5 = 0; lVar5 < (p->vType).nSize; lVar5 = lVar5 + 1) {
      i = (int)lVar5;
      iVar2 = Bac_ObjIsBox(p,i);
      if (iVar2 != 0) {
        BVar3 = Bac_ObjType(p,i);
        iVar2 = 1;
        if (BVar3 == BAC_OBJ_BOX) {
          pBVar1 = p->pDesign;
          iVar2 = Bac_ObjIsBox(p,i);
          if (iVar2 == 0) {
            __assert_fail("Bac_ObjIsBox(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                          ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
          }
          if ((p->vFanin).nSize <= lVar5) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar2 = (p->vFanin).pArray[lVar5];
          if (((long)iVar2 < 1) || (pBVar1->nNtks < iVar2)) {
            p_00 = (Bac_Ntk_t *)0x0;
          }
          else {
            p_00 = pBVar1->pNtks + iVar2;
          }
          iVar2 = Bac_ManBoxNum_rec(p_00);
        }
        iVar4 = iVar4 + iVar2;
      }
    }
    p->Count = iVar4;
  }
  return iVar4;
}

Assistant:

static inline int Bac_ManBoxNum_rec( Bac_Ntk_t * p )
{
    int iObj, Counter = 0;
    if ( p->Count >= 0 )
        return p->Count;
    Bac_NtkForEachBox( p, iObj )
        Counter += Bac_ObjIsBoxUser(p, iObj) ? Bac_ManBoxNum_rec( Bac_BoxNtk(p, iObj) ) : 1;
    return (p->Count = Counter);
}